

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O2

bool __thiscall
r_exec::_Mem::load(_Mem *this,vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *objects,
                  uint64_t stdin_oid,uint64_t stdout_oid,uint64_t self_oid)

{
  pointer ppCVar1;
  Group *object;
  _Hash_node_base this_00;
  char cVar2;
  uchar uVar3;
  bool bVar4;
  short sVar5;
  undefined2 uVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ModelBase *this_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  Group *this_02;
  Code **ppCVar9;
  ulong uVar10;
  __node_base *p_Var11;
  ulong uVar12;
  Group *local_78;
  vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *local_70;
  Code **local_68;
  uint64_t local_60;
  vector<r_exec::Group*,std::allocator<r_exec::Group*>> *local_58;
  Code **local_50;
  uint64_t local_48;
  Code **local_40;
  uint64_t local_38;
  
  local_60 = self_oid;
  local_48 = stdout_oid;
  local_38 = stdin_oid;
  r_code::Utils::SetReferenceValues
            (this->base_period,this->float_tolerance,
             ((double)CONCAT44(0x45300000,(int)(this->time_tolerance >> 0x20)) -
             1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)this->time_tolerance) - 4503599627370496.0));
  core::P<r_exec::Group>::operator=
            (&this->_root,
             (Group *)*(objects->super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  store(this,(Code *)(this->_root).object);
  local_58 = (vector<r_exec::Group*,std::allocator<r_exec::Group*>> *)&this->initial_groups;
  local_78 = (Group *)(this->_root).object;
  std::vector<r_exec::Group*,std::allocator<r_exec::Group*>>::emplace_back<r_exec::Group*>
            (local_58,&local_78);
  (**(code **)(*(long *)this + 0x10))
            (this,((long)(objects->
                         super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(objects->
                         super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 3) + -1);
  local_68 = &this->_self;
  local_50 = &this->_stdout;
  local_40 = &this->_stdin;
  uVar10 = 1;
  local_70 = objects;
  do {
    ppCVar1 = (local_70->super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    uVar12 = (long)(local_70->super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar1 >> 3;
    if (uVar12 <= uVar10) {
LAB_00196f58:
      return uVar12 <= uVar10;
    }
    object = (Group *)ppCVar1[uVar10];
    store(this,(Code *)object);
    iVar7 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[2])(object);
    ppCVar9 = local_40;
    if (((CONCAT44(extraout_var,iVar7) == local_38) ||
        (iVar7 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                   super_LObject.super_Code.super__Object._vptr__Object[2])(object),
        ppCVar9 = local_50, CONCAT44(extraout_var_00,iVar7) == local_48)) ||
       (iVar7 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object._vptr__Object[2])(object),
       ppCVar9 = local_68, CONCAT44(extraout_var_01,iVar7) == local_60)) {
      *ppCVar9 = (local_70->super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar10];
    }
    (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
      super_Code.super__Object._vptr__Object[4])(object,0);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x37) {
      iVar7 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
                .super_Code.super__Object._vptr__Object[9])(object,0);
      (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar7) + 0x20))
                ((long *)CONCAT44(extraout_var_02,iVar7),0);
      sVar5 = r_code::Atom::asOpcode();
      if (sVar5 == Opcodes::Pgm) {
        iVar7 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object._vptr__Object[9])(object,0);
        iVar8 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object._vptr__Object[9])(object,0);
        (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar8) + 0x20))
                  ((long *)CONCAT44(extraout_var_04,iVar8),2);
        uVar6 = r_code::Atom::asIndex();
        (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x20))
                  ((long *)CONCAT44(extraout_var_03,iVar7),uVar6);
        cVar2 = r_code::Atom::getAtomCount();
        if (cVar2 != '\0') goto LAB_00196eea;
        (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[4])(object,0);
        uVar3 = r_code::Atom::asOpcode();
        (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[4])(object,0);
        r_code::Atom::getAtomCount();
        r_code::Atom::InstantiatedInputLessProgram((ushort)&local_78,uVar3);
        iVar7 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object._vptr__Object[4])(object,0);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar7),(Atom *)&local_78);
      }
      else {
        (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[4])(object,0);
        uVar3 = r_code::Atom::asOpcode();
        (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.super__Object._vptr__Object[4])(object,0);
        r_code::Atom::getAtomCount();
        r_code::Atom::InstantiatedAntiProgram((ushort)&local_78,uVar3);
        iVar7 = (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object._vptr__Object[4])(object,0);
        r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_06,iVar7),(Atom *)&local_78);
      }
      r_code::Atom::~Atom((Atom *)&local_78);
    }
    else if (cVar2 == -0x33) {
      unpack_hlp(this,(Code *)object);
    }
    else if (cVar2 == -0x32) {
      unpack_hlp(this,(Code *)object);
      this_01 = ModelBase::Get();
      ModelBase::load(this_01,(Code *)object);
    }
LAB_00196eea:
    p_Var11 = &(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
               super_Code.views._M_h._M_before_begin;
    while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
      this_00._M_nxt = p_Var11[1]._M_nxt;
      View::set_object((View *)this_00._M_nxt,(Code *)object);
      this_02 = View::get_host((View *)this_00._M_nxt);
      bVar4 = Group::load(this_02,(View *)this_00._M_nxt,(Code *)object);
      if (!bVar4) goto LAB_00196f58;
    }
    (*(object->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
      super_Code.super__Object._vptr__Object[4])(object,0);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x38) {
      local_78 = object;
      std::vector<r_exec::Group*,std::allocator<r_exec::Group*>>::emplace_back<r_exec::Group*>
                (local_58,&local_78);
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

bool _Mem::load(std::vector<r_code::Code *> *objects, uint64_t stdin_oid, uint64_t stdout_oid, uint64_t self_oid)
{
    Utils::SetReferenceValues(base_period, float_tolerance, time_tolerance);
    // load root (always comes first).
    _root = (Group *)(*objects)[0];
    store((Code *)_root);
    initial_groups.push_back(_root);
    set_last_oid(objects->size() - 1);

    for (uint64_t i = 1; i < objects->size(); ++i) { // skip root as it has no initial views.
        Code *object = (*objects)[i];
        store(object);

        if (object->get_oid() == stdin_oid) {
            _stdin = (Group *)(*objects)[i];
        } else if (object->get_oid() == stdout_oid) {
            _stdout = (Group *)(*objects)[i];
        } else if (object->get_oid() == self_oid) {
            _self = (*objects)[i];
        }

        switch (object->code(0).getDescriptor()) {
        case Atom::MODEL:
            unpack_hlp(object);
            //object->add_reference(NULL); // classifier.
            ModelBase::Get()->load(object);
            break;

        case Atom::COMPOSITE_STATE:
            unpack_hlp(object);
            break;

        case Atom::INSTANTIATED_PROGRAM: // refine the opcode depending on the inputs and the program type.
            if (object->get_reference(0)->code(0).asOpcode() == Opcodes::Pgm) {
                if (object->get_reference(0)->code(object->get_reference(0)->code(PGM_INPUTS).asIndex()).getAtomCount() == 0) {
                    object->code(0) = Atom::InstantiatedInputLessProgram(object->code(0).asOpcode(), object->code(0).getAtomCount());
                }
            } else {
                object->code(0) = Atom::InstantiatedAntiProgram(object->code(0).asOpcode(), object->code(0).getAtomCount());
            }

            break;
        }

        std::unordered_set<r_code::View *, r_code::View::Hash, r_code::View::Equal>::const_iterator v;

        for (v = object->views.begin(); v != object->views.end(); ++v) {
            // init hosts' member_set.
            View *view = (r_exec::View *)*v;
            view->set_object(object);
            Group *host = view->get_host();

            if (!host->load(view, object)) {
                return false;
            }
        }

        if (object->code(0).getDescriptor() == Atom::GROUP) {
            initial_groups.push_back((Group *)object);    // convenience to create initial update jobs - see start().
        }
    }

    return true;
}